

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_nurbssurface.cpp
# Opt level: O0

bool __thiscall
ON_NurbsSurface::TensorProduct
          (ON_NurbsSurface *this,ON_NurbsCurve *nurbscurveA,ON_NurbsCurve *nurbscurveB,
          ON_TensorProduct *tensor)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int dim;
  int iVar5;
  int cv_count1;
  int iVar6;
  int order1;
  uint uVar7;
  double *pdVar8;
  double *pdVar9;
  double local_f0;
  double local_e0;
  double local_d8;
  bool local_a1;
  int is_ratC;
  int is_ratB;
  int is_ratA;
  int dimC;
  int dimB;
  int dimA;
  int cv_countB;
  int cv_countA;
  int k;
  int j;
  int i;
  double *cvC;
  double *cvB;
  double *cvA;
  double wC;
  double wB;
  double wA;
  bool rc;
  ON_TensorProduct *tensor_local;
  ON_NurbsCurve *nurbscurveB_local;
  ON_NurbsCurve *nurbscurveA_local;
  ON_NurbsSurface *this_local;
  
  ON_Surface::DestroySurfaceTree(&this->super_ON_Surface);
  iVar3 = (*(nurbscurveA->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x18])()
  ;
  iVar4 = (*(nurbscurveB->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x18])()
  ;
  dim = (*tensor->_vptr_ON_TensorProduct[4])();
  iVar5 = (*tensor->_vptr_ON_TensorProduct[2])();
  if (iVar3 < iVar5) {
    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_nurbssurface.cpp"
               ,0xaeb,"","ON_NurbsSurface::TensorProduct() - tensor.DimensionA() > dimA");
    this_local._7_1_ = false;
  }
  else {
    iVar5 = (*tensor->_vptr_ON_TensorProduct[3])();
    if (iVar4 < iVar5) {
      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_nurbssurface.cpp"
                 ,0xaef,"","ON_NurbsSurface::TensorProduct() - tensor.DimensionB() > dimB");
      this_local._7_1_ = false;
    }
    else {
      bVar1 = ON_NurbsCurve::IsRational(nurbscurveA);
      bVar2 = ON_NurbsCurve::IsRational(nurbscurveB);
      local_a1 = bVar1 || bVar2;
      iVar5 = ON_NurbsCurve::CVCount(nurbscurveA);
      cv_count1 = ON_NurbsCurve::CVCount(nurbscurveB);
      iVar6 = ON_NurbsCurve::Order(nurbscurveA);
      order1 = ON_NurbsCurve::Order(nurbscurveB);
      Create(this,dim,local_a1,iVar6,order1,iVar5,cv_count1);
      if (this->m_knot[0] != nurbscurveA->m_knot) {
        pdVar8 = this->m_knot[0];
        pdVar9 = nurbscurveA->m_knot;
        iVar6 = KnotCount(this,0);
        memcpy(pdVar8,pdVar9,(long)iVar6 << 3);
      }
      if (this->m_knot[1] != nurbscurveB->m_knot) {
        pdVar8 = this->m_knot[1];
        pdVar9 = nurbscurveB->m_knot;
        iVar6 = KnotCount(this,1);
        memcpy(pdVar8,pdVar9,(long)iVar6 << 3);
      }
      for (k = 0; k < iVar5; k = k + 1) {
        pdVar8 = ON_NurbsCurve::CV(nurbscurveA,k);
        for (cv_countA = 0; cv_countA < cv_count1; cv_countA = cv_countA + 1) {
          pdVar9 = ON_NurbsCurve::CV(nurbscurveB,cv_countA);
          _j = CV(this,k,cv_countA);
          if (bVar1) {
            local_d8 = pdVar8[iVar3];
          }
          else {
            local_d8 = 1.0;
          }
          if (bVar2) {
            local_e0 = pdVar9[iVar4];
          }
          else {
            local_e0 = 1.0;
          }
          if ((local_d8 != 0.0) || (NAN(local_d8))) {
            local_f0 = 1.0 / local_d8;
          }
          else {
            local_f0 = 0.0;
          }
          uVar7 = (*tensor->_vptr_ON_TensorProduct[5])(local_f0,tensor,pdVar8,pdVar9,_j);
          if ((uVar7 & 1) == 0) {
            return false;
          }
          if (local_a1) {
            for (cv_countB = 0; cv_countB < dim; cv_countB = cv_countB + 1) {
              *_j = local_d8 * local_e0 * *_j;
              _j = _j + 1;
            }
            *_j = local_d8 * local_e0;
          }
        }
      }
      this_local._7_1_ = true;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool ON_NurbsSurface::TensorProduct(
      const ON_NurbsCurve& nurbscurveA,
      const ON_NurbsCurve& nurbscurveB,
      ON_TensorProduct& tensor
      )
{
  DestroySurfaceTree();
  //   The resulting surface will satisfy
  // 	 NurbSrf(s,t) = T( NurbA(s), NurbB(t) )
  // 
  //   If you want to understand the relationship between multilinear maps
  //   and tensor products, read chapter 16 of Serge Lang's Algebra book.
  //   The connection between Lang and tensor product nurb surfaces being
  //   that NurbA and NurbB are elements of the module of piecewise polynomial
  //   functions that satisfy certain degree and continuity constraints.

  bool rc;
	double wA, wB, wC;
	const double *cvA, *cvB;
	double *cvC;
	int i, j, k,  cv_countA, cv_countB, dimA, dimB, dimC, is_ratA, is_ratB, is_ratC;

	dimA = nurbscurveA.Dimension();
	dimB = nurbscurveB.Dimension();
	dimC = tensor.DimensionC();

  if ( tensor.DimensionA() > dimA ) {
    ON_ERROR("ON_NurbsSurface::TensorProduct() - tensor.DimensionA() > dimA");
    return false;
  }
  if ( tensor.DimensionB() > dimB ) {
    ON_ERROR("ON_NurbsSurface::TensorProduct() - tensor.DimensionB() > dimB");
    return false;
  }

	is_ratA = nurbscurveA.IsRational();
	is_ratB = nurbscurveB.IsRational();
	is_ratC = (is_ratA || is_ratB);
  cv_countA = nurbscurveA.CVCount();
  cv_countB = nurbscurveB.CVCount();

  Create( dimC, is_ratC, nurbscurveA.Order(), nurbscurveB.Order(), cv_countA, cv_countB );

  if ( m_knot[0] != nurbscurveA.m_knot )
    memcpy( m_knot[0], nurbscurveA.m_knot, KnotCount(0)*sizeof(*m_knot[0]) );
  if ( m_knot[1] != nurbscurveB.m_knot )
    memcpy( m_knot[1], nurbscurveB.m_knot, KnotCount(1)*sizeof(*m_knot[1]) );

	for (i = 0; i < cv_countA; i++) {
    cvA = nurbscurveA.CV(i);
		for (j = 0; j < cv_countB; j++) {
  		cvB = nurbscurveB.CV(j);
      cvC = CV(i,j);
			wA = (is_ratA) ? cvA[dimA] : 1.0;
			wB = (is_ratB) ? cvB[dimB] : 1.0;
			rc = tensor.Evaluate( (wA == 0.0) ? 0.0 : 1.0/wA, cvA, 
									          (wB == 0.0) ? 0.0 : 1.0/wB, cvB, 
									          cvC );
      if ( !rc )
        return false;
			if (is_ratC) {
  			wC = wA*wB;
        for ( k = 0; k < dimC; k++ )
          *cvC++ *= wC;
        *cvC = wC;
			}
		}
	}
	return true;
}